

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duhtag.c
# Opt level: O2

char * duh_get_tag(DUH *duh,char *key)

{
  char *(*papcVar1) [2];
  long lVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  
  if (duh == (DUH *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    papcVar1 = duh->tag;
    pcVar5 = (char *)0x0;
    if (papcVar1 != (char *(*) [2])0x0) {
      pcVar6 = (char *)(ulong)(uint)duh->n_tags;
      if (duh->n_tags < 1) {
        pcVar6 = pcVar5;
      }
      lVar2 = 0;
      do {
        lVar4 = lVar2;
        if ((long)pcVar6 * 0x10 + 0x10 == lVar4 + 0x10) {
          return (char *)0x0;
        }
        iVar3 = strcmp(key,*(char **)((long)*papcVar1 + lVar4));
        lVar2 = lVar4 + 0x10;
      } while (iVar3 != 0);
      pcVar5 = *(char **)((long)*papcVar1 + lVar4 + 8);
    }
  }
  return pcVar5;
}

Assistant:

const char *DUMBEXPORT duh_get_tag(DUH *duh, const char *key)
{
	int i;
	ASSERT(key);
	if (!duh || !duh->tag) return NULL;

	for (i = 0; i < duh->n_tags; i++)
		if (strcmp(key, duh->tag[i][0]) == 0)
			return duh->tag[i][1];

	return NULL;
}